

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

void wallet::InterpretFeeEstimationInstructions
               (UniValue *conf_target,UniValue *estimate_mode,UniValue *fee_rate,UniValue *options)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  UniValue *in_stack_fffffffffffffc08;
  UniValue *in_stack_fffffffffffffc10;
  UniValue *in_stack_fffffffffffffc18;
  UniValue *in_stack_fffffffffffffc30;
  UniValue *in_stack_fffffffffffffc38;
  UniValue *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  UniValue *in_stack_fffffffffffffc58;
  bool local_389;
  bool local_2ea;
  undefined1 local_29b [2];
  allocator<char> local_299;
  allocator<char> local_298 [2];
  allocator<char> local_296;
  allocator<char> local_295;
  allocator<char> local_294 [2];
  allocator<char> local_292;
  allocator<char> local_291 [649];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (allocator<char> *)in_stack_fffffffffffffc48);
  bVar3 = UniValue::exists(in_stack_fffffffffffffc10,(string *)in_stack_fffffffffffffc08);
  local_2ea = true;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc58,
               (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (allocator<char> *)in_stack_fffffffffffffc48);
    local_2ea = UniValue::exists(in_stack_fffffffffffffc10,(string *)in_stack_fffffffffffffc08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc08);
    std::allocator<char>::~allocator(&local_292);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(local_291);
  if (local_2ea == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc58,
               (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (allocator<char> *)in_stack_fffffffffffffc48);
    UniValue::UniValue(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                     in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    UniValue::~UniValue(in_stack_fffffffffffffc08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc08);
    std::allocator<char>::~allocator(local_294);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc58,
               (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (allocator<char> *)in_stack_fffffffffffffc48);
    UniValue::UniValue(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                     in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    UniValue::~UniValue(in_stack_fffffffffffffc08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc08);
    std::allocator<char>::~allocator(&local_295);
  }
  else {
    bVar3 = UniValue::isNull(in_stack_fffffffffffffc08);
    if ((!bVar3) || (bVar3 = UniValue::isNull(in_stack_fffffffffffffc08), !bVar3)) {
      uVar5 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc58,
                 (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                 (allocator<char> *)in_stack_fffffffffffffc48);
      JSONRPCError((int)((ulong)in_stack_fffffffffffffc58 >> 0x20),in_stack_fffffffffffffc48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00cb7e18;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (allocator<char> *)in_stack_fffffffffffffc48);
  bVar3 = UniValue::exists(in_stack_fffffffffffffc10,(string *)in_stack_fffffffffffffc08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_296);
  if (bVar3) {
    bVar3 = UniValue::isNull(in_stack_fffffffffffffc08);
    if (!bVar3) {
      uVar5 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc58,
                 (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                 (allocator<char> *)in_stack_fffffffffffffc48);
      JSONRPCError((int)((ulong)in_stack_fffffffffffffc58 >> 0x20),in_stack_fffffffffffffc48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00cb7e18;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc58,
               (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (allocator<char> *)in_stack_fffffffffffffc48);
    UniValue::UniValue(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                     in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    UniValue::~UniValue(in_stack_fffffffffffffc08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc08);
    std::allocator<char>::~allocator(local_298);
  }
  std::allocator<char>::allocator();
  bVar2 = false;
  bVar1 = false;
  bVar3 = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (allocator<char> *)in_stack_fffffffffffffc48);
  UniValue::operator[](in_stack_fffffffffffffc18,(string *)in_stack_fffffffffffffc10);
  bVar4 = UniValue::isNull(in_stack_fffffffffffffc08);
  local_389 = false;
  if (!bVar4) {
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc58,
               (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (allocator<char> *)in_stack_fffffffffffffc48);
    bVar1 = true;
    in_stack_fffffffffffffc58 =
         UniValue::operator[](in_stack_fffffffffffffc18,(string *)in_stack_fffffffffffffc10);
    bVar3 = UniValue::isNull(in_stack_fffffffffffffc08);
    in_stack_fffffffffffffc57 = true;
    bVar3 = !bVar3;
    local_389 = (bool)in_stack_fffffffffffffc57;
    if (bVar3) {
      in_stack_fffffffffffffc48 = (string *)local_29b;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc58,
                 (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                 (allocator<char> *)in_stack_fffffffffffffc48);
      UniValue::operator[](in_stack_fffffffffffffc18,(string *)in_stack_fffffffffffffc10);
      UniValue::get_str_abi_cxx11_(in_stack_fffffffffffffc10);
      in_stack_fffffffffffffc57 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
      local_389 = (bool)in_stack_fffffffffffffc57;
    }
  }
  if (bVar3) {
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc08);
    std::allocator<char>::~allocator((allocator<char> *)local_29b);
  }
  if (bVar1) {
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc08);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)(local_29b + 1));
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_299);
  if (local_389 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    uVar5 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc58,
               (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (allocator<char> *)in_stack_fffffffffffffc48);
    JSONRPCError((int)((ulong)in_stack_fffffffffffffc58 >> 0x20),in_stack_fffffffffffffc48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_00cb7e18:
  __stack_chk_fail();
}

Assistant:

static void InterpretFeeEstimationInstructions(const UniValue& conf_target, const UniValue& estimate_mode, const UniValue& fee_rate, UniValue& options)
{
    if (options.exists("conf_target") || options.exists("estimate_mode")) {
        if (!conf_target.isNull() || !estimate_mode.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Pass conf_target and estimate_mode either as arguments or in the options object, but not both");
        }
    } else {
        options.pushKV("conf_target", conf_target);
        options.pushKV("estimate_mode", estimate_mode);
    }
    if (options.exists("fee_rate")) {
        if (!fee_rate.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Pass the fee_rate either as an argument, or in the options object, but not both");
        }
    } else {
        options.pushKV("fee_rate", fee_rate);
    }
    if (!options["conf_target"].isNull() && (options["estimate_mode"].isNull() || (options["estimate_mode"].get_str() == "unset"))) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Specify estimate_mode");
    }
}